

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::OnRender(CHud *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  CGameClient *pCVar4;
  IGraphics *pIVar5;
  CNetObj_Character *pCharacter;
  long lVar6;
  
  pCVar4 = (this->super_CComponent).m_pClient;
  if (((pCVar4->m_Snap).m_pGameData != (CNetObj_GameData *)0x0) &&
     (pCVar4->m_pMenus->m_MenuActive == false)) {
    uVar3 = (pCVar4->m_GameInfo).m_GameFlags;
    pIVar5 = pCVar4->m_pGraphics;
    uVar1 = pIVar5->m_ScreenWidth;
    uVar2 = pIVar5->m_ScreenHeight;
    this->m_Width = ((float)(int)uVar1 / (float)(int)uVar2) * 300.0;
    this->m_Height = 300.0;
    (*(pIVar5->super_IInterface)._vptr_IInterface[5])(0,0);
    pCVar4 = (this->super_CComponent).m_pClient;
    if (pCVar4->m_pConfig->m_ClShowhud != 0) {
      pCharacter = (pCVar4->m_Snap).m_pLocalCharacter;
      if ((pCharacter == (CNetObj_Character *)0x0) ||
         ((((pCVar4->m_Snap).m_pGameData)->m_GameStateFlags & 0xc) != 0)) {
        if ((pCVar4->m_Snap).m_SpecInfo.m_Active == true) {
          lVar6 = (long)(pCVar4->m_Snap).m_SpecInfo.m_SpectatorID;
          if (lVar6 != -1) {
            RenderHealthAndAmmo(this,&(pCVar4->m_Snap).m_aCharacters[lVar6].m_Cur);
            if ((uVar3 & 8) != 0) {
              pCVar4 = (this->super_CComponent).m_pClient;
              RenderRaceTime(this,(pCVar4->m_Snap).m_paPlayerInfosRace
                                  [(pCVar4->m_Snap).m_SpecInfo.m_SpectatorID]);
              RenderCheckpoint(this);
            }
          }
          RenderSpectatorHud(this);
          RenderSpectatorNotification(this);
        }
      }
      else {
        RenderHealthAndAmmo(this,pCharacter);
        if ((uVar3 & 8) != 0) {
          pCVar4 = (this->super_CComponent).m_pClient;
          lVar6 = (long)pCVar4->m_LocalClientID;
          if (lVar6 != -1) {
            RenderRaceTime(this,(pCVar4->m_Snap).m_paPlayerInfosRace[lVar6]);
            RenderCheckpoint(this);
          }
        }
      }
      RenderGameTimer(this);
      RenderPauseTimer(this);
      RenderStartCountdown(this);
      RenderNetworkIssueNotification(this);
      RenderDeadNotification(this);
      RenderScoreHud(this);
      RenderWarmupTimer(this);
      RenderFps(this);
      if (((this->super_CComponent).m_pClient)->m_pClient->m_State != 4) {
        RenderConnectionWarning(this);
      }
      RenderTeambalanceWarning(this);
      RenderVoting(this);
      RenderLocalTime(this,(this->m_Width / 7.0) * 3.0);
    }
    RenderCursor(this);
    return;
  }
  return;
}

Assistant:

void CHud::OnRender()
{
	if(!m_pClient->m_Snap.m_pGameData)
		return;

	// dont render hud if the menu is active
	if(m_pClient->m_pMenus->IsActive())
		return;

	bool Race = m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE;

	m_Width = 300.0f*Graphics()->ScreenAspect();
	m_Height = 300.0f;
	Graphics()->MapScreen(0.0f, 0.0f, m_Width, m_Height);

	if(Config()->m_ClShowhud)
	{
		if(m_pClient->m_Snap.m_pLocalCharacter && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
		{
			RenderHealthAndAmmo(m_pClient->m_Snap.m_pLocalCharacter);
			if(Race && m_pClient->m_LocalClientID != -1)
			{
				RenderRaceTime(m_pClient->m_Snap.m_paPlayerInfosRace[m_pClient->m_LocalClientID]);
				RenderCheckpoint();
			}
		}
		else if(m_pClient->m_Snap.m_SpecInfo.m_Active)
		{
			if(m_pClient->m_Snap.m_SpecInfo.m_SpectatorID != -1)
			{
				RenderHealthAndAmmo(&m_pClient->m_Snap.m_aCharacters[m_pClient->m_Snap.m_SpecInfo.m_SpectatorID].m_Cur);
				if(Race)
				{
					RenderRaceTime(m_pClient->m_Snap.m_paPlayerInfosRace[m_pClient->m_Snap.m_SpecInfo.m_SpectatorID]);
					RenderCheckpoint();
				}
			}
			RenderSpectatorHud();
			RenderSpectatorNotification();
		}

		RenderGameTimer();
		RenderPauseTimer();
		RenderStartCountdown();
		RenderNetworkIssueNotification();
		RenderDeadNotification();
		RenderScoreHud();
		RenderWarmupTimer();
		RenderFps();
		if(Client()->State() != IClient::STATE_DEMOPLAYBACK)
			RenderConnectionWarning();
		RenderTeambalanceWarning();
		RenderVoting();
		RenderLocalTime((m_Width/7)*3);
	}
	RenderCursor();
}